

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hlslParseHelper.cpp
# Opt level: O3

TIntermTyped * __thiscall
glslang::HlslParseContext::handleAssign
          (HlslParseContext *this,TSourceLoc *loc,TOperator op,TIntermTyped *left,
          TIntermTyped *right)

{
  EShLanguage EVar1;
  TIntermediate *pTVar2;
  _func_int **pp_Var3;
  char cVar4;
  bool bVar5;
  bool bVar6;
  bool bVar7;
  bool bVar8;
  int iVar9;
  int iVar10;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  TIntermTyped *pTVar11;
  undefined4 extraout_var_02;
  undefined4 extraout_var_03;
  long *plVar12;
  undefined4 extraout_var_04;
  undefined4 extraout_var_05;
  undefined4 extraout_var_06;
  undefined4 extraout_var_07;
  undefined4 extraout_var_08;
  undefined4 extraout_var_09;
  undefined4 extraout_var_10;
  undefined4 extraout_var_11;
  undefined4 extraout_var_12;
  undefined4 extraout_var_13;
  undefined4 extraout_var_14;
  long lVar13;
  undefined4 extraout_var_15;
  undefined4 extraout_var_16;
  undefined4 extraout_var_17;
  TIntermSymbol *pTVar14;
  undefined4 extraout_var_18;
  undefined4 extraout_var_19;
  TIntermSymbol *pTVar15;
  undefined4 extraout_var_20;
  undefined4 extraout_var_21;
  undefined4 extraout_var_22;
  TIntermSymbol *__args_3;
  undefined4 extraout_var_23;
  undefined4 extraout_var_24;
  undefined4 extraout_var_25;
  undefined4 extraout_var_26;
  undefined4 extraout_var_27;
  undefined4 extraout_var_28;
  TIntermAggregate *pTVar16;
  undefined4 extraout_var_29;
  TVariable *variable;
  undefined4 extraout_var_30;
  TQualifier *this_00;
  undefined4 extraout_var_31;
  undefined4 extraout_var_32;
  undefined4 extraout_var_33;
  TIntermConstantUnion *index;
  _Base_ptr p_Var17;
  _Base_ptr p_Var18;
  TSourceLoc *pTVar19;
  _Base_ptr p_Var20;
  TOperator TVar21;
  bool isSplitLeft;
  bool isSplitRight;
  bool isFlattenRight;
  bool isFlattenLeft;
  TIntermAggregate *assignList;
  TStorageQualifier leftStorage;
  TVector<glslang::TVariable_*> *rightVariables;
  TVector<glslang::TVariable_*> *leftVariables;
  anon_class_8_1_8991fb9c assignsClipPos;
  int rightOffset;
  int leftOffset;
  int rightOffsetStart;
  int leftOffsetStart;
  TStorageQualifier rightStorage;
  vector<int,_std::allocator<int>_> arrayElement;
  anon_class_104_13_1d5e7770 getMember;
  TType derefType;
  char local_1d0;
  char local_1cf;
  undefined1 local_1ce;
  undefined1 local_1cd;
  TOperator local_1cc;
  TIntermSymbol *local_1c8;
  TVariable *local_1c0;
  TIntermSymbol *local_1b8;
  TSourceLoc *local_1b0;
  TIntermAggregate *local_1a8;
  uint local_1a0;
  TOperator local_19c;
  _Base_ptr *local_198;
  _Base_ptr *local_190;
  HlslParseContext *local_188;
  int local_17c;
  int local_178;
  int local_174;
  int local_170;
  uint local_16c;
  void *local_168;
  undefined8 uStack_160;
  long local_158;
  char *local_150;
  char *local_148;
  HlslParseContext *local_140;
  uint *local_138;
  uint *local_130;
  void **local_128;
  TSourceLoc *local_120;
  int *local_118;
  _Base_ptr **local_110;
  int *local_108;
  int *local_100;
  _Base_ptr **local_f8;
  int *local_f0;
  _Any_data local_e8;
  code *local_d8;
  code *local_d0;
  TType local_c8;
  
  if (right == (TIntermTyped *)0x0 || left == (TIntermTyped *)0x0) {
    return (TIntermTyped *)0x0;
  }
  local_19c = op;
  iVar9 = (*(left->super_TIntermNode)._vptr_TIntermNode[0x1e])(left);
  cVar4 = (**(code **)(*(long *)CONCAT44(extraout_var,iVar9) + 0x1b0))
                    ((long *)CONCAT44(extraout_var,iVar9));
  if (cVar4 != '\0') {
    ((this->super_TParseContextBase).super_TParseVersions.intermediate)->needToLegalize = true;
  }
  iVar9 = (*(left->super_TIntermNode)._vptr_TIntermNode[4])(left);
  if ((CONCAT44(extraout_var_00,iVar9) != 0) &&
     (iVar9 = (*(left->super_TIntermNode)._vptr_TIntermNode[4])(left),
     *(int *)(CONCAT44(extraout_var_01,iVar9) + 0xb8) == 0x2d7)) {
    pTVar11 = handleAssignToMatrixSwizzle(this,loc,op,left,right);
    return pTVar11;
  }
  local_188 = this;
  iVar9 = (*(left->super_TIntermNode)._vptr_TIntermNode[0x18])(left);
  local_1c8 = (TIntermSymbol *)CONCAT44(extraout_var_02,iVar9);
  if (local_1c8 == (TIntermSymbol *)0x0) {
    iVar9 = (*(left->super_TIntermNode)._vptr_TIntermNode[0x14])(left);
    plVar12 = (long *)CONCAT44(extraout_var_03,iVar9);
    if ((plVar12 == (long *)0x0) || (1 < (int)plVar12[0x17] - 0x33U)) {
      local_1c8 = (TIntermSymbol *)0x0;
    }
    else {
      plVar12 = (long *)(**(code **)(*plVar12 + 400))(plVar12);
      local_1c8 = (TIntermSymbol *)(**(code **)(*plVar12 + 0x60))(plVar12);
    }
  }
  iVar9 = (*(right->super_TIntermNode)._vptr_TIntermNode[0x18])(right);
  local_1c0 = (TVariable *)CONCAT44(extraout_var_04,iVar9);
  if (local_1c0 == (TVariable *)0x0) {
    iVar9 = (*(right->super_TIntermNode)._vptr_TIntermNode[0x14])(right);
    plVar12 = (long *)CONCAT44(extraout_var_05,iVar9);
    if ((plVar12 == (long *)0x0) || (1 < (int)plVar12[0x17] - 0x33U)) {
      local_1c0 = (TVariable *)0x0;
    }
    else {
      plVar12 = (long *)(**(code **)(*plVar12 + 400))(plVar12);
      local_1c0 = (TVariable *)(**(code **)(*plVar12 + 0x60))(plVar12);
    }
  }
  local_1cc = op;
  bVar5 = wasSplit(this,left);
  bVar7 = true;
  bVar6 = true;
  if (!bVar5) {
    iVar9 = (*(left->super_TIntermNode)._vptr_TIntermNode[0x14])(left);
    plVar12 = (long *)CONCAT44(extraout_var_06,iVar9);
    if ((plVar12 == (long *)0x0) || (1 < (int)plVar12[0x17] - 0x33U)) {
      bVar6 = false;
    }
    else {
      pTVar11 = (TIntermTyped *)(**(code **)(*plVar12 + 400))(plVar12);
      bVar6 = wasSplit(this,pTVar11);
    }
  }
  local_1d0 = bVar6;
  local_1b0 = loc;
  bVar5 = wasSplit(this,right);
  if (!bVar5) {
    iVar9 = (*(right->super_TIntermNode)._vptr_TIntermNode[0x14])(right);
    plVar12 = (long *)CONCAT44(extraout_var_07,iVar9);
    if ((plVar12 == (long *)0x0) || (1 < (int)plVar12[0x17] - 0x33U)) {
      bVar7 = false;
    }
    else {
      pTVar11 = (TIntermTyped *)(**(code **)(*plVar12 + 400))(plVar12);
      bVar7 = wasSplit(this,pTVar11);
    }
  }
  local_1cf = bVar7;
  local_1b8 = (TIntermSymbol *)right;
  bVar5 = wasFlattened(this,&local_1c8->super_TIntermTyped);
  local_1cd = bVar5;
  bVar8 = wasFlattened(this,(TIntermTyped *)local_1c0);
  local_1ce = bVar8;
  if ((((!bVar8) && (!bVar5)) && (bVar6 == false)) && (bVar7 == false)) {
    iVar9 = (*(left->super_TIntermNode)._vptr_TIntermNode[0x1e])(left);
    lVar13 = (**(code **)(*(long *)CONCAT44(extraout_var_25,iVar9) + 0x58))
                       ((long *)CONCAT44(extraout_var_25,iVar9));
    pTVar14 = local_1b8;
    if (1 < (*(uint *)(lVar13 + 8) >> 7 & 0x1ff) - 0x21) {
      iVar9 = (*(local_1b8->super_TIntermTyped).super_TIntermNode._vptr_TIntermNode[0x1e])
                        (local_1b8);
      lVar13 = (**(code **)(*(long *)CONCAT44(extraout_var_26,iVar9) + 0x58))
                         ((long *)CONCAT44(extraout_var_26,iVar9));
      if (1 < (*(uint *)(lVar13 + 8) >> 7 & 0x1ff) - 0x21) {
        iVar9 = (*(left->super_TIntermNode)._vptr_TIntermNode[0x1e])(left);
        lVar13 = (**(code **)(*(long *)CONCAT44(extraout_var_31,iVar9) + 0x58))
                           ((long *)CONCAT44(extraout_var_31,iVar9));
        if ((((*(uint *)(lVar13 + 8) & 0xff80) == 0xf00) &&
            (EVar1 = (this->super_TParseContextBase).super_TParseVersions.language,
            EVar1 < EShLangFragment)) && (EVar1 != EShLangTessControl)) {
          pTVar11 = assignPosition(this,local_1b0,local_1cc,left,&local_1b8->super_TIntermTyped);
          return pTVar11;
        }
        iVar9 = (*(left->super_TIntermNode)._vptr_TIntermNode[0x21])(left);
        TVar21 = local_1cc;
        pTVar19 = local_1b0;
        pTVar14 = local_1b8;
        if ((((*(uint *)(CONCAT44(extraout_var_32,iVar9) + 8) & 0xff80) == 0x2380) &&
            (iVar9 = (*(left->super_TIntermNode)._vptr_TIntermNode[0x2a])(left), pTVar14 = local_1b8
            , pTVar19 = local_1b0, (char)iVar9 != '\0')) &&
           (iVar9 = (*(local_1b8->super_TIntermTyped).super_TIntermNode._vptr_TIntermNode[0x2a])
                              (local_1b8), pTVar19 = local_1b0, (char)iVar9 == '\0')) {
          iVar9 = (*(left->super_TIntermNode)._vptr_TIntermNode[0x1e])(left);
          TType::TType(&local_c8,(TType *)CONCAT44(extraout_var_33,iVar9),0,false);
          pTVar2 = (this->super_TParseContextBase).super_TParseVersions.intermediate;
          index = TIntermediate::addConstantUnion(pTVar2,0,pTVar19,false);
          left = TIntermediate::addIndex
                           (pTVar2,EOpIndexDirect,left,&index->super_TIntermTyped,pTVar19);
          TVar21 = local_1cc;
          (*(left->super_TIntermNode)._vptr_TIntermNode[0x1d])(left,&local_c8);
        }
        pTVar11 = TIntermediate::addAssign
                            ((this->super_TParseContextBase).super_TParseVersions.intermediate,
                             TVar21,left,&pTVar14->super_TIntermTyped,pTVar19);
        return pTVar11;
      }
    }
    iVar9 = (*(left->super_TIntermNode)._vptr_TIntermNode[0x1e])(left);
    lVar13 = (**(code **)(*(long *)CONCAT44(extraout_var_27,iVar9) + 0x58))
                       ((long *)CONCAT44(extraout_var_27,iVar9));
    pTVar15 = pTVar14;
    if ((*(uint *)(lVar13 + 8) >> 7 & 0x1ff) - 0x21 < 2) {
      pTVar15 = (TIntermSymbol *)left;
    }
    iVar9 = (*(pTVar15->super_TIntermTyped).super_TIntermNode._vptr_TIntermNode[0x1e])();
    lVar13 = (**(code **)(*(long *)CONCAT44(extraout_var_28,iVar9) + 0x58))
                       ((long *)CONCAT44(extraout_var_28,iVar9));
    pTVar16 = assignClipCullDistance
                        (this,local_1b0,local_1cc,*(uint *)(lVar13 + 0x1c) & 0xfff,left,
                         &pTVar14->super_TIntermTyped);
    return (TIntermTyped *)pTVar16;
  }
  iVar10 = 0;
  local_1a8 = (TIntermAggregate *)0x0;
  local_190 = (_Base_ptr *)0x0;
  local_198 = (_Base_ptr *)0x0;
  iVar9 = (*(left->super_TIntermNode)._vptr_TIntermNode[0x1e])(left);
  cVar4 = (**(code **)(*(long *)CONCAT44(extraout_var_08,iVar9) + 0x128))
                    ((long *)CONCAT44(extraout_var_08,iVar9));
  if (cVar4 != '\0') {
    iVar9 = (*(left->super_TIntermNode)._vptr_TIntermNode[0x1e])(left);
    plVar12 = (long *)CONCAT44(extraout_var_09,iVar9);
    cVar4 = (**(code **)(*plVar12 + 0x128))(plVar12);
    if (cVar4 == '\0') {
      __assert_fail("isStruct()",
                    "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/glslang/glslang/MachineIndependent/../Include/Types.h"
                    ,0x9df,"const TTypeList *glslang::TType::getStruct() const");
    }
    iVar10 = (int)((ulong)(*(long *)(plVar12[0xd] + 0x10) - *(long *)(plVar12[0xd] + 8)) >> 5);
  }
  iVar9 = (*(left->super_TIntermNode)._vptr_TIntermNode[0x1e])(left);
  cVar4 = (**(code **)(*(long *)CONCAT44(extraout_var_10,iVar9) + 0xe8))
                    ((long *)CONCAT44(extraout_var_10,iVar9));
  if (cVar4 != '\0') {
    iVar9 = (*(left->super_TIntermNode)._vptr_TIntermNode[0x1e])(left);
    iVar10 = (**(code **)(*(long *)CONCAT44(extraout_var_11,iVar9) + 0x88))
                       ((long *)CONCAT44(extraout_var_11,iVar9));
  }
  if (bVar5) {
    iVar9 = (*(local_1c8->super_TIntermTyped).super_TIntermNode._vptr_TIntermNode[0x30])();
    lVar13 = CONCAT44(extraout_var_12,iVar9);
    p_Var18 = (this->flattenMap).
              super_map<long_long,_glslang::HlslParseContext::TFlattenData,_std::less<long_long>,_glslang::pool_allocator<std::pair<const_long_long,_glslang::HlslParseContext::TFlattenData>_>_>
              ._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
    p_Var17 = &(this->flattenMap).
               super_map<long_long,_glslang::HlslParseContext::TFlattenData,_std::less<long_long>,_glslang::pool_allocator<std::pair<const_long_long,_glslang::HlslParseContext::TFlattenData>_>_>
               ._M_t._M_impl.super__Rb_tree_header._M_header;
    p_Var20 = p_Var17;
    if (p_Var18 != (_Base_ptr)0x0) {
      do {
        if (lVar13 <= *(long *)(p_Var18 + 1)) {
          p_Var20 = p_Var18;
        }
        p_Var18 = (&p_Var18->_M_left)[*(long *)(p_Var18 + 1) < lVar13];
      } while (p_Var18 != (_Base_ptr)0x0);
      if ((p_Var20 != p_Var17) && (*(long *)(p_Var20 + 1) <= lVar13)) {
        p_Var17 = p_Var20;
      }
    }
    local_190 = &p_Var17[1]._M_parent;
  }
  pTVar14 = local_1b8;
  if (bVar8) {
    iVar9 = (*((TIntermNode *)&local_1c0->super_TSymbol)->_vptr_TIntermNode[0x30])();
    lVar13 = CONCAT44(extraout_var_13,iVar9);
    p_Var18 = (this->flattenMap).
              super_map<long_long,_glslang::HlslParseContext::TFlattenData,_std::less<long_long>,_glslang::pool_allocator<std::pair<const_long_long,_glslang::HlslParseContext::TFlattenData>_>_>
              ._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
    p_Var17 = &(this->flattenMap).
               super_map<long_long,_glslang::HlslParseContext::TFlattenData,_std::less<long_long>,_glslang::pool_allocator<std::pair<const_long_long,_glslang::HlslParseContext::TFlattenData>_>_>
               ._M_t._M_impl.super__Rb_tree_header._M_header;
    p_Var20 = p_Var17;
    if (p_Var18 != (_Base_ptr)0x0) {
      do {
        if (lVar13 <= *(long *)(p_Var18 + 1)) {
          p_Var20 = p_Var18;
        }
        p_Var18 = (&p_Var18->_M_left)[*(long *)(p_Var18 + 1) < lVar13];
      } while (p_Var18 != (_Base_ptr)0x0);
      if ((p_Var20 != p_Var17) && (*(long *)(p_Var20 + 1) <= lVar13)) {
        p_Var17 = p_Var20;
      }
    }
    local_198 = &p_Var17[1]._M_parent;
LAB_0040b63f:
    local_1c0 = (TVariable *)0x0;
    local_1c8 = (TIntermSymbol *)0x0;
    pTVar14 = local_1b8;
  }
  else {
    if (iVar10 < 2) goto LAB_0040b63f;
    iVar9 = (*(local_1b8->super_TIntermTyped).super_TIntermNode._vptr_TIntermNode[0xc])(local_1b8);
    pp_Var3 = (pTVar14->super_TIntermTyped).super_TIntermNode._vptr_TIntermNode;
    if (CONCAT44(extraout_var_23,iVar9) == 0) {
      iVar9 = (*pp_Var3[0x1e])(pTVar14);
      variable = makeInternalVariable(this,"flattenTemp",(TType *)CONCAT44(extraout_var_29,iVar9));
      iVar9 = (*(variable->super_TSymbol)._vptr_TSymbol[0xd])(variable);
      this_00 = (TQualifier *)
                (**(code **)(*(long *)CONCAT44(extraout_var_30,iVar9) + 0x50))
                          ((long *)CONCAT44(extraout_var_30,iVar9));
      TQualifier::makeTemporary(this_00);
      pTVar19 = local_1b0;
      local_1c0 = variable;
      pTVar15 = TIntermediate::addSymbol
                          ((this->super_TParseContextBase).super_TParseVersions.intermediate,
                           variable,local_1b0);
      pTVar2 = (this->super_TParseContextBase).super_TParseVersions.intermediate;
      pTVar11 = TIntermediate::addAssign
                          (pTVar2,local_1cc,&pTVar15->super_TIntermTyped,
                           &pTVar14->super_TIntermTyped,pTVar19);
      local_1c8 = (TIntermSymbol *)0x0;
      local_1a8 = TIntermediate::growAggregate
                            (pTVar2,(TIntermNode *)0x0,&pTVar11->super_TIntermNode,pTVar19);
    }
    else {
      iVar9 = (*pp_Var3[0xc])();
      local_1c8 = (TIntermSymbol *)CONCAT44(extraout_var_24,iVar9);
      local_1c0 = (TVariable *)0x0;
    }
  }
  local_168 = (void *)0x0;
  uStack_160 = 0;
  local_158 = 0;
  iVar9 = (*(left->super_TIntermNode)._vptr_TIntermNode[0x1e])(left);
  lVar13 = (**(code **)(*(long *)CONCAT44(extraout_var_14,iVar9) + 0x58))
                     ((long *)CONCAT44(extraout_var_14,iVar9));
  local_1a0 = *(uint *)(lVar13 + 8) & 0x7f;
  iVar9 = (*(pTVar14->super_TIntermTyped).super_TIntermNode._vptr_TIntermNode[0x1e])(pTVar14);
  lVar13 = (**(code **)(*(long *)CONCAT44(extraout_var_15,iVar9) + 0x58))
                     ((long *)CONCAT44(extraout_var_15,iVar9));
  local_16c = *(uint *)(lVar13 + 8) & 0x7f;
  iVar9 = findSubtreeOffset(this,&left->super_TIntermNode);
  local_170 = iVar9;
  local_17c = findSubtreeOffset(this,(TIntermNode *)pTVar14);
  local_f0 = &local_174;
  local_118 = &local_178;
  local_100 = &local_17c;
  local_150 = &local_1d0;
  local_128 = &local_168;
  local_120 = local_1b0;
  local_110 = &local_190;
  local_f8 = &local_198;
  local_178 = iVar9;
  local_174 = local_17c;
  local_148 = &local_1cf;
  local_140 = this;
  local_138 = &local_1a0;
  local_130 = &local_16c;
  local_108 = &local_170;
  if (local_1c0 == (TVariable *)0x0) {
    if (local_1c8 != (TIntermSymbol *)0x0) {
      local_1b8 = TIntermediate::addSymbol
                            ((this->super_TParseContextBase).super_TParseVersions.intermediate,
                             local_1c8);
    }
  }
  else {
    local_1b8 = TIntermediate::addSymbol
                          ((this->super_TParseContextBase).super_TParseVersions.intermediate,
                           local_1c0,local_1b0);
  }
  local_e8._8_8_ = 0;
  local_e8._M_unused._M_object = operator_new(0x70);
  pTVar19 = local_1b0;
  pTVar14 = local_1b8;
  *(undefined1 **)local_e8._M_unused._0_8_ = &local_1cd;
  *(HlslParseContext **)((long)local_e8._M_unused._0_8_ + 8) = this;
  *(uint **)((long)local_e8._M_unused._0_8_ + 0x10) = &local_1a0;
  *(undefined1 **)((long)local_e8._M_unused._0_8_ + 0x18) = &local_1ce;
  *(uint **)((long)local_e8._M_unused._0_8_ + 0x20) = &local_16c;
  *(char **)((long)local_e8._M_unused._0_8_ + 0x28) = &local_1d0;
  *(char **)((long)local_e8._M_unused._0_8_ + 0x30) = &local_1cf;
  *(void ***)((long)local_e8._M_unused._0_8_ + 0x38) = &local_168;
  *(char ***)((long)local_e8._M_unused._0_8_ + 0x40) = &local_150;
  *(_Any_data **)((long)local_e8._M_unused._0_8_ + 0x48) = &local_e8;
  *(TIntermAggregate ***)((long)local_e8._M_unused._0_8_ + 0x50) = &local_1a8;
  *(TOperator **)((long)local_e8._M_unused._0_8_ + 0x58) = &local_19c;
  *(TSourceLoc **)((long)local_e8._M_unused._0_8_ + 0x60) = local_1b0;
  *(HlslParseContext ***)((long)local_e8._M_unused._0_8_ + 0x68) = &local_188;
  local_d0 = std::
             _Function_handler<void_(glslang::TIntermTyped_*,_glslang::TIntermTyped_*,_glslang::TIntermTyped_*,_glslang::TIntermTyped_*,_bool),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/glslang/glslang/HLSL/hlslParseHelper.cpp:3072:16)>
             ::_M_invoke;
  local_d8 = std::
             _Function_handler<void_(glslang::TIntermTyped_*,_glslang::TIntermTyped_*,_glslang::TIntermTyped_*,_glslang::TIntermTyped_*,_bool),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/glslang/glslang/HLSL/hlslParseHelper.cpp:3072:16)>
             ::_M_manager;
  pTVar15 = (TIntermSymbol *)left;
  if (local_1d0 == '\x01') {
    iVar9 = (*(left->super_TIntermNode)._vptr_TIntermNode[0x14])(left);
    plVar12 = (long *)CONCAT44(extraout_var_16,iVar9);
    if ((plVar12 != (long *)0x0) && ((int)plVar12[0x17] - 0x33U < 2)) {
      pTVar11 = (TIntermTyped *)(**(code **)(*plVar12 + 400))(plVar12);
      bVar5 = wasSplit(this,pTVar11);
      if (bVar5) {
        iVar9 = (*(left->super_TIntermNode)._vptr_TIntermNode[8])(left);
        plVar12 = (long *)(**(code **)(*(long *)CONCAT44(extraout_var_17,iVar9) + 400))
                                    ((long *)CONCAT44(extraout_var_17,iVar9));
        plVar12 = (long *)(**(code **)(*plVar12 + 0x60))(plVar12);
        pTVar2 = (this->super_TParseContextBase).super_TParseVersions.intermediate;
        lVar13 = (**(code **)(*plVar12 + 0x180))(plVar12);
        p_Var18 = (this->splitNonIoVars).
                  super_map<long_long,_glslang::TVariable_*,_std::less<long_long>,_glslang::pool_allocator<std::pair<const_long_long,_glslang::TVariable_*>_>_>
                  ._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
        p_Var17 = &(this->splitNonIoVars).
                   super_map<long_long,_glslang::TVariable_*,_std::less<long_long>,_glslang::pool_allocator<std::pair<const_long_long,_glslang::TVariable_*>_>_>
                   ._M_t._M_impl.super__Rb_tree_header._M_header;
        do {
          if (lVar13 <= *(long *)(p_Var18 + 1)) {
            p_Var17 = p_Var18;
          }
          p_Var18 = (&p_Var18->_M_left)[*(long *)(p_Var18 + 1) < lVar13];
        } while (p_Var18 != (_Base_ptr)0x0);
        pTVar14 = TIntermediate::addSymbol(pTVar2,(TVariable *)p_Var17[1]._M_parent,pTVar19);
        pTVar2 = (this->super_TParseContextBase).super_TParseVersions.intermediate;
        iVar9 = (*(left->super_TIntermNode)._vptr_TIntermNode[8])(left);
        TVar21 = *(TOperator *)(CONCAT44(extraout_var_18,iVar9) + 0xb8);
        iVar9 = (*(left->super_TIntermNode)._vptr_TIntermNode[8])(left);
        pTVar11 = (TIntermTyped *)
                  (**(code **)(*(long *)CONCAT44(extraout_var_19,iVar9) + 0x198))
                            ((long *)CONCAT44(extraout_var_19,iVar9));
        pTVar19 = local_1b0;
        pTVar15 = (TIntermSymbol *)
                  TIntermediate::addIndex
                            (pTVar2,TVar21,&pTVar14->super_TIntermTyped,pTVar11,local_1b0);
        iVar9 = (*(pTVar14->super_TIntermTyped).super_TIntermNode._vptr_TIntermNode[0x1e])(pTVar14);
        TType::TType(&local_c8,(TType *)CONCAT44(extraout_var_20,iVar9),0,false);
        (*(pTVar15->super_TIntermTyped).super_TIntermNode._vptr_TIntermNode[0x1d])
                  (pTVar15,&local_c8);
        pTVar14 = local_1b8;
        goto LAB_0040b9c8;
      }
    }
    iVar9 = (*(left->super_TIntermNode)._vptr_TIntermNode[0xc])(left);
    pTVar2 = (this->super_TParseContextBase).super_TParseVersions.intermediate;
    lVar13 = (**(code **)(*(long *)CONCAT44(extraout_var_21,iVar9) + 0x180))
                       ((long *)CONCAT44(extraout_var_21,iVar9));
    p_Var18 = (this->splitNonIoVars).
              super_map<long_long,_glslang::TVariable_*,_std::less<long_long>,_glslang::pool_allocator<std::pair<const_long_long,_glslang::TVariable_*>_>_>
              ._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
    p_Var17 = &(this->splitNonIoVars).
               super_map<long_long,_glslang::TVariable_*,_std::less<long_long>,_glslang::pool_allocator<std::pair<const_long_long,_glslang::TVariable_*>_>_>
               ._M_t._M_impl.super__Rb_tree_header._M_header;
    do {
      if (lVar13 <= *(long *)(p_Var18 + 1)) {
        p_Var17 = p_Var18;
      }
      p_Var18 = (&p_Var18->_M_left)[*(long *)(p_Var18 + 1) < lVar13];
    } while (p_Var18 != (_Base_ptr)0x0);
    pTVar15 = TIntermediate::addSymbol(pTVar2,(TVariable *)p_Var17[1]._M_parent,pTVar19);
  }
LAB_0040b9c8:
  __args_3 = pTVar14;
  if (local_1cf == '\x01') {
    pTVar2 = (this->super_TParseContextBase).super_TParseVersions.intermediate;
    iVar9 = (*(pTVar14->super_TIntermTyped).super_TIntermNode._vptr_TIntermNode[0xc])(pTVar14);
    lVar13 = (**(code **)(*(long *)CONCAT44(extraout_var_22,iVar9) + 0x180))
                       ((long *)CONCAT44(extraout_var_22,iVar9));
    p_Var17 = (this->splitNonIoVars).
              super_map<long_long,_glslang::TVariable_*,_std::less<long_long>,_glslang::pool_allocator<std::pair<const_long_long,_glslang::TVariable_*>_>_>
              ._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
    p_Var18 = &(this->splitNonIoVars).
               super_map<long_long,_glslang::TVariable_*,_std::less<long_long>,_glslang::pool_allocator<std::pair<const_long_long,_glslang::TVariable_*>_>_>
               ._M_t._M_impl.super__Rb_tree_header._M_header;
    do {
      if (lVar13 <= *(long *)(p_Var17 + 1)) {
        p_Var18 = p_Var17;
      }
      p_Var17 = (&p_Var17->_M_left)[*(long *)(p_Var17 + 1) < lVar13];
    } while (p_Var17 != (_Base_ptr)0x0);
    __args_3 = TIntermediate::addSymbol(pTVar2,(TVariable *)p_Var18[1]._M_parent,pTVar19);
  }
  std::
  function<void_(glslang::TIntermTyped_*,_glslang::TIntermTyped_*,_glslang::TIntermTyped_*,_glslang::TIntermTyped_*,_bool)>
  ::operator()((function<void_(glslang::TIntermTyped_*,_glslang::TIntermTyped_*,_glslang::TIntermTyped_*,_glslang::TIntermTyped_*,_bool)>
                *)&local_e8,left,&pTVar14->super_TIntermTyped,&pTVar15->super_TIntermTyped,
               &__args_3->super_TIntermTyped,true);
  if (local_1a8 != (TIntermAggregate *)0x0) {
    (*(local_1a8->super_TIntermOperator).super_TIntermTyped.super_TIntermNode._vptr_TIntermNode
      [0x31])(local_1a8,1);
    pTVar16 = local_1a8;
    if (local_d8 != (code *)0x0) {
      (*local_d8)(&local_e8,&local_e8,__destroy_functor);
    }
    if (local_168 != (void *)0x0) {
      operator_delete(local_168,local_158 - (long)local_168);
    }
    return (TIntermTyped *)pTVar16;
  }
  __assert_fail("assignList != nullptr",
                "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/glslang/glslang/HLSL/hlslParseHelper.cpp"
                ,0xc98,
                "TIntermTyped *glslang::HlslParseContext::handleAssign(const TSourceLoc &, TOperator, TIntermTyped *, TIntermTyped *)"
               );
}

Assistant:

TIntermTyped* HlslParseContext::handleAssign(const TSourceLoc& loc, TOperator op, TIntermTyped* left,
                                             TIntermTyped* right)
{
    if (left == nullptr || right == nullptr)
        return nullptr;

    // writing to opaques will require fixing transforms
    if (left->getType().containsOpaque())
        intermediate.setNeedsLegalization();

    if (left->getAsOperator() && left->getAsOperator()->getOp() == EOpMatrixSwizzle)
        return handleAssignToMatrixSwizzle(loc, op, left, right);

    // Return true if the given node is an index operation into a split variable.
    const auto indexesSplit = [this](const TIntermTyped* node) -> bool {
        const TIntermBinary* binaryNode = node->getAsBinaryNode();

        if (binaryNode == nullptr)
            return false;

        return (binaryNode->getOp() == EOpIndexDirect || binaryNode->getOp() == EOpIndexIndirect) &&
               wasSplit(binaryNode->getLeft());
    };

    // Return symbol if node is symbol or index ref
    const auto getSymbol = [](const TIntermTyped* node) -> const TIntermSymbol* {
        const TIntermSymbol* symbolNode = node->getAsSymbolNode();
        if (symbolNode != nullptr)
            return symbolNode;

        const TIntermBinary* binaryNode = node->getAsBinaryNode();
        if (binaryNode != nullptr && (binaryNode->getOp() == EOpIndexDirect || binaryNode->getOp() == EOpIndexIndirect))
            return binaryNode->getLeft()->getAsSymbolNode();

        return nullptr;
    };

    // Return true if this stage assigns clip position with potentially inverted Y
    const auto assignsClipPos = [this](const TIntermTyped* node) -> bool {
        return node->getType().getQualifier().builtIn == EbvPosition &&
               (language == EShLangVertex || language == EShLangGeometry || language == EShLangTessEvaluation);
    };

    const TIntermSymbol* leftSymbol = getSymbol(left);
    const TIntermSymbol* rightSymbol = getSymbol(right);

    const bool isSplitLeft    = wasSplit(left) || indexesSplit(left);
    const bool isSplitRight   = wasSplit(right) || indexesSplit(right);

    const bool isFlattenLeft  = wasFlattened(leftSymbol);
    const bool isFlattenRight = wasFlattened(rightSymbol);

    // OK to do a single assign if neither side is split or flattened.  Otherwise,
    // fall through to a member-wise copy.
    if (!isFlattenLeft && !isFlattenRight && !isSplitLeft && !isSplitRight) {
        // Clip and cull distance requires more processing.  See comment above assignClipCullDistance.
        if (isClipOrCullDistance(left->getType()) || isClipOrCullDistance(right->getType())) {
            const bool isOutput = isClipOrCullDistance(left->getType());

            const int semanticId = (isOutput ? left : right)->getType().getQualifier().layoutLocation;
            return assignClipCullDistance(loc, op, semanticId, left, right);
        } else if (assignsClipPos(left)) {
            // Position can require special handling: see comment above assignPosition
            return assignPosition(loc, op, left, right);
        } else if (left->getQualifier().builtIn == EbvSampleMask) {
            // Certain builtins are required to be arrayed outputs in SPIR-V, but may internally be scalars
            // in the shader.  Copy the scalar RHS into the LHS array element zero, if that happens.
            if (left->isArray() && !right->isArray()) {
                const TType derefType(left->getType(), 0);
                left = intermediate.addIndex(EOpIndexDirect, left, intermediate.addConstantUnion(0, loc), loc);
                left->setType(derefType);
                // Fall through to add assign.
            }
        }

        return intermediate.addAssign(op, left, right, loc);
    }

    TIntermAggregate* assignList = nullptr;
    const TVector<TVariable*>* leftVariables = nullptr;
    const TVector<TVariable*>* rightVariables = nullptr;

    // A temporary to store the right node's value, so we don't keep indirecting into it
    // if it's not a simple symbol.
    TVariable* rhsTempVar = nullptr;

    // If the RHS is a simple symbol node, we'll copy it for each member.
    TIntermSymbol* cloneSymNode = nullptr;

    int memberCount = 0;

    // Track how many items there are to copy.
    if (left->getType().isStruct())
        memberCount = (int)left->getType().getStruct()->size();
    if (left->getType().isArray())
        memberCount = left->getType().getCumulativeArraySize();

    if (isFlattenLeft)
        leftVariables = &flattenMap.find(leftSymbol->getId())->second.members;

    if (isFlattenRight) {
        rightVariables = &flattenMap.find(rightSymbol->getId())->second.members;
    } else {
        // The RHS is not flattened.  There are several cases:
        // 1. 1 item to copy:  Use the RHS directly.
        // 2. >1 item, simple symbol RHS: we'll create a new TIntermSymbol node for each, but no assign to temp.
        // 3. >1 item, complex RHS: assign it to a new temp variable, and create a TIntermSymbol for each member.

        if (memberCount <= 1) {
            // case 1: we'll use the symbol directly below.  Nothing to do.
        } else {
            if (right->getAsSymbolNode() != nullptr) {
                // case 2: we'll copy the symbol per iteration below.
                cloneSymNode = right->getAsSymbolNode();
            } else {
                // case 3: assign to a temp, and indirect into that.
                rhsTempVar = makeInternalVariable("flattenTemp", right->getType());
                rhsTempVar->getWritableType().getQualifier().makeTemporary();
                TIntermTyped* noFlattenRHS = intermediate.addSymbol(*rhsTempVar, loc);

                // Add this to the aggregate being built.
                assignList = intermediate.growAggregate(assignList,
                                                        intermediate.addAssign(op, noFlattenRHS, right, loc), loc);
            }
        }
    }

    // When dealing with split arrayed structures of built-ins, the arrayness is moved to the extracted built-in
    // variables, which is awkward when copying between split and unsplit structures.  This variable tracks
    // array indirections so they can be percolated from outer structs to inner variables.
    std::vector <int> arrayElement;

    TStorageQualifier leftStorage = left->getType().getQualifier().storage;
    TStorageQualifier rightStorage = right->getType().getQualifier().storage;

    int leftOffsetStart = findSubtreeOffset(*left);
    int rightOffsetStart = findSubtreeOffset(*right);
    int leftOffset = leftOffsetStart;
    int rightOffset = rightOffsetStart;

    const auto getMember = [&](bool isLeft, const TType& type, int member, TIntermTyped* splitNode, int splitMember,
                               bool flattened)
                           -> TIntermTyped * {
        const bool split     = isLeft ? isSplitLeft   : isSplitRight;

        TIntermTyped* subTree;
        const TType derefType(type, member);
        const TVariable* builtInVar = nullptr;
        if ((flattened || split) && derefType.isBuiltIn()) {
            auto splitPair = splitBuiltIns.find(HlslParseContext::tInterstageIoData(
                                                   derefType.getQualifier().builtIn,
                                                   isLeft ? leftStorage : rightStorage));
            if (splitPair != splitBuiltIns.end())
                builtInVar = splitPair->second;
        }
        if (builtInVar != nullptr) {
            // copy from interstage IO built-in if needed
            subTree = intermediate.addSymbol(*builtInVar);

            if (subTree->getType().isArray()) {
                // Arrayness of builtIn symbols isn't handled by the normal recursion:
                // it's been extracted and moved to the built-in.
                if (!arrayElement.empty()) {
                    const TType splitDerefType(subTree->getType(), arrayElement.back());
                    subTree = intermediate.addIndex(EOpIndexDirect, subTree,
                                                    intermediate.addConstantUnion(arrayElement.back(), loc), loc);
                    subTree->setType(splitDerefType);
                } else if (splitNode->getAsOperator() != nullptr && (splitNode->getAsOperator()->getOp() == EOpIndexIndirect)) {
                    // This might also be a stage with arrayed outputs, in which case there's an index
                    // operation we should transfer to the output builtin.

                    const TType splitDerefType(subTree->getType(), 0);
                    subTree = intermediate.addIndex(splitNode->getAsOperator()->getOp(), subTree,
                                                    splitNode->getAsBinaryNode()->getRight(), loc);
                    subTree->setType(splitDerefType);
                }
            }
        } else if (flattened && !shouldFlatten(derefType, isLeft ? leftStorage : rightStorage, false)) {
            if (isLeft) {
                // offset will cycle through variables for arrayed io
                if (leftOffset >= static_cast<int>(leftVariables->size()))
                    leftOffset = leftOffsetStart;
                subTree = intermediate.addSymbol(*(*leftVariables)[leftOffset++]);
            } else {
                // offset will cycle through variables for arrayed io
                if (rightOffset >= static_cast<int>(rightVariables->size()))
                    rightOffset = rightOffsetStart;
                subTree = intermediate.addSymbol(*(*rightVariables)[rightOffset++]);
            }

            // arrayed io
            if (subTree->getType().isArray()) {
                if (!arrayElement.empty()) {
                    const TType derefType(subTree->getType(), arrayElement.front());
                    subTree = intermediate.addIndex(EOpIndexDirect, subTree,
                                                    intermediate.addConstantUnion(arrayElement.front(), loc), loc);
                    subTree->setType(derefType);
                } else {
                    // There's an index operation we should transfer to the output builtin.
                    assert(splitNode->getAsOperator() != nullptr &&
                           splitNode->getAsOperator()->getOp() == EOpIndexIndirect);
                    const TType splitDerefType(subTree->getType(), 0);
                    subTree = intermediate.addIndex(splitNode->getAsOperator()->getOp(), subTree,
                                                    splitNode->getAsBinaryNode()->getRight(), loc);
                    subTree->setType(splitDerefType);
                }
            }
        } else {
            // Index operator if it's an aggregate, else EOpNull
            const TOperator accessOp = type.isArray()  ? EOpIndexDirect
                                     : type.isStruct() ? EOpIndexDirectStruct
                                     : EOpNull;
            if (accessOp == EOpNull) {
                subTree = splitNode;
            } else {
                subTree = intermediate.addIndex(accessOp, splitNode, intermediate.addConstantUnion(splitMember, loc),
                                                loc);
                const TType splitDerefType(splitNode->getType(), splitMember);
                subTree->setType(splitDerefType);
            }
        }

        return subTree;
    };

    // Use the proper RHS node: a new symbol from a TVariable, copy
    // of an TIntermSymbol node, or sometimes the right node directly.
    right = rhsTempVar != nullptr   ? intermediate.addSymbol(*rhsTempVar, loc) :
            cloneSymNode != nullptr ? intermediate.addSymbol(*cloneSymNode) :
            right;

    // Cannot use auto here, because this is recursive, and auto can't work out the type without seeing the
    // whole thing.  So, we'll resort to an explicit type via std::function.
    const std::function<void(TIntermTyped* left, TIntermTyped* right, TIntermTyped* splitLeft, TIntermTyped* splitRight,
                             bool topLevel)>
    traverse = [&](TIntermTyped* left, TIntermTyped* right, TIntermTyped* splitLeft, TIntermTyped* splitRight,
                   bool topLevel) -> void {
        // If we get here, we are assigning to or from a whole array or struct that must be
        // flattened, so have to do member-by-member assignment:

        bool shouldFlattenSubsetLeft = isFlattenLeft && shouldFlatten(left->getType(), leftStorage, topLevel);
        bool shouldFlattenSubsetRight = isFlattenRight && shouldFlatten(right->getType(), rightStorage, topLevel);

        if ((left->getType().isArray() || right->getType().isArray()) &&
              (shouldFlattenSubsetLeft  || isSplitLeft ||
               shouldFlattenSubsetRight || isSplitRight)) {
            const int elementsL = left->getType().isArray()  ? left->getType().getOuterArraySize()  : 1;
            const int elementsR = right->getType().isArray() ? right->getType().getOuterArraySize() : 1;

            // The arrays might not be the same size,
            // e.g., if the size has been forced for EbvTessLevelInner/Outer.
            const int elementsToCopy = std::min(elementsL, elementsR);

            // array case
            for (int element = 0; element < elementsToCopy; ++element) {
                arrayElement.push_back(element);

                // Add a new AST symbol node if we have a temp variable holding a complex RHS.
                TIntermTyped* subLeft  = getMember(true,  left->getType(),  element, left, element,
                                                   shouldFlattenSubsetLeft);
                TIntermTyped* subRight = getMember(false, right->getType(), element, right, element,
                                                   shouldFlattenSubsetRight);

                TIntermTyped* subSplitLeft =  isSplitLeft  ? getMember(true,  left->getType(),  element, splitLeft,
                                                                       element, shouldFlattenSubsetLeft)
                                                           : subLeft;
                TIntermTyped* subSplitRight = isSplitRight ? getMember(false, right->getType(), element, splitRight,
                                                                       element, shouldFlattenSubsetRight)
                                                           : subRight;

                traverse(subLeft, subRight, subSplitLeft, subSplitRight, false);

                arrayElement.pop_back();
            }
        } else if (left->getType().isStruct() && (shouldFlattenSubsetLeft  || isSplitLeft ||
                                                  shouldFlattenSubsetRight || isSplitRight)) {
            // struct case
            const auto& membersL = *left->getType().getStruct();
            const auto& membersR = *right->getType().getStruct();

            // These track the members in the split structures corresponding to the same in the unsplit structures,
            // which we traverse in parallel.
            int memberL = 0;
            int memberR = 0;

            // Handle empty structure assignment
            if (int(membersL.size()) == 0 && int(membersR.size()) == 0)
                assignList = intermediate.growAggregate(assignList, intermediate.addAssign(op, left, right, loc), loc);

            for (int member = 0; member < int(membersL.size()); ++member) {
                const TType& typeL = *membersL[member].type;
                const TType& typeR = *membersR[member].type;

                TIntermTyped* subLeft  = getMember(true,  left->getType(), member, left, member,
                                                   shouldFlattenSubsetLeft);
                TIntermTyped* subRight = getMember(false, right->getType(), member, right, member,
                                                   shouldFlattenSubsetRight);

                // If there is no splitting, use the same values to avoid inefficiency.
                TIntermTyped* subSplitLeft =  isSplitLeft  ? getMember(true,  left->getType(),  member, splitLeft,
                                                                       memberL, shouldFlattenSubsetLeft)
                                                           : subLeft;
                TIntermTyped* subSplitRight = isSplitRight ? getMember(false, right->getType(), member, splitRight,
                                                                       memberR, shouldFlattenSubsetRight)
                                                           : subRight;

                if (isClipOrCullDistance(subSplitLeft->getType()) || isClipOrCullDistance(subSplitRight->getType())) {
                    // Clip and cull distance built-in assignment is complex in its own right, and is handled in
                    // a separate function dedicated to that task.  See comment above assignClipCullDistance;

                    const bool isOutput = isClipOrCullDistance(subSplitLeft->getType());

                    // Since all clip/cull semantics boil down to the same built-in type, we need to get the
                    // semantic ID from the dereferenced type's layout location, to avoid an N-1 mapping.
                    const TType derefType((isOutput ? left : right)->getType(), member);
                    const int semanticId = derefType.getQualifier().layoutLocation;

                    TIntermAggregate* clipCullAssign = assignClipCullDistance(loc, op, semanticId,
                                                                              subSplitLeft, subSplitRight);

                    assignList = intermediate.growAggregate(assignList, clipCullAssign, loc);
                } else if (subSplitRight->getType().getQualifier().builtIn == EbvFragCoord) {
                    // FragCoord can require special handling: see comment above assignFromFragCoord
                    TIntermTyped* fragCoordAssign = assignFromFragCoord(loc, op, subSplitLeft, subSplitRight);
                    assignList = intermediate.growAggregate(assignList, fragCoordAssign, loc);
                } else if (assignsClipPos(subSplitLeft)) {
                    // Position can require special handling: see comment above assignPosition
                    TIntermTyped* positionAssign = assignPosition(loc, op, subSplitLeft, subSplitRight);
                    assignList = intermediate.growAggregate(assignList, positionAssign, loc);
                } else if (!shouldFlattenSubsetLeft && !shouldFlattenSubsetRight &&
                           !typeL.containsBuiltIn() && !typeR.containsBuiltIn()) {
                    // If this is the final flattening (no nested types below to flatten)
                    // we'll copy the member, else recurse into the type hierarchy.
                    // However, if splitting the struct, that means we can copy a whole
                    // subtree here IFF it does not itself contain any interstage built-in
                    // IO variables, so we only have to recurse into it if there's something
                    // for splitting to do.  That can save a lot of AST verbosity for
                    // a bunch of memberwise copies.

                    assignList = intermediate.growAggregate(assignList,
                                                            intermediate.addAssign(op, subSplitLeft, subSplitRight, loc),
                                                            loc);
                } else {
                    traverse(subLeft, subRight, subSplitLeft, subSplitRight, false);
                }

                memberL += (typeL.isBuiltIn() ? 0 : 1);
                memberR += (typeR.isBuiltIn() ? 0 : 1);
            }
        } else {
            // Member copy
            assignList = intermediate.growAggregate(assignList, intermediate.addAssign(op, left, right, loc), loc);
        }

    };

    TIntermTyped* splitLeft  = left;
    TIntermTyped* splitRight = right;

    // If either left or right was a split structure, we must read or write it, but still have to
    // parallel-recurse through the unsplit structure to identify the built-in IO vars.
    // The left can be either a symbol, or an index into a symbol (e.g, array reference)
    if (isSplitLeft) {
        if (indexesSplit(left)) {
            // Index case: Refer to the indexed symbol, if the left is an index operator.
            const TIntermSymbol* symNode = left->getAsBinaryNode()->getLeft()->getAsSymbolNode();

            TIntermTyped* splitLeftNonIo = intermediate.addSymbol(*getSplitNonIoVar(symNode->getId()), loc);

            splitLeft = intermediate.addIndex(left->getAsBinaryNode()->getOp(), splitLeftNonIo,
                                              left->getAsBinaryNode()->getRight(), loc);

            const TType derefType(splitLeftNonIo->getType(), 0);
            splitLeft->setType(derefType);
        } else {
            // Symbol case: otherwise, if not indexed, we have the symbol directly.
            const TIntermSymbol* symNode = left->getAsSymbolNode();
            splitLeft = intermediate.addSymbol(*getSplitNonIoVar(symNode->getId()), loc);
        }
    }

    if (isSplitRight)
        splitRight = intermediate.addSymbol(*getSplitNonIoVar(right->getAsSymbolNode()->getId()), loc);

    // This makes the whole assignment, recursing through subtypes as needed.
    traverse(left, right, splitLeft, splitRight, true);

    assert(assignList != nullptr);
    assignList->setOperator(EOpSequence);

    return assignList;
}